

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O2

jas_image_t * pnm_decode(jas_stream_t *in,char *optstr)

{
  byte *pbVar1;
  jas_image_cmpt_t **ppjVar2;
  bool bVar3;
  jas_stream_t *pjVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  jas_tvparser_t *tvp;
  jas_taginfo_t *pjVar10;
  jas_image_t *image;
  undefined4 extraout_var;
  jas_matrix_t *pjVar11;
  ushort **ppuVar12;
  jas_clrspc_t jVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  uint_fast32_t uVar17;
  uint_fast32_t maxval;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar21;
  uint local_158;
  int local_154;
  ulong local_148;
  undefined4 local_13c;
  uint_fast32_t tmpval;
  ulong local_130;
  jas_stream_t *local_128;
  undefined8 local_120;
  ulong local_118;
  int local_10c;
  int_fast32_t width;
  undefined8 uStack_100;
  undefined8 local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  jas_image_cmptparm_t cmptparms [3];
  
  iVar5 = jas_getdbglevel();
  if (9 < iVar5) {
    pcVar15 = optstr;
    if (optstr == (char *)0x0) {
      pcVar15 = "";
    }
    jas_eprintf("pnm_decode(%p, \"%s\")\n",in,pcVar15);
  }
  pcVar15 = "";
  if (optstr != (char *)0x0) {
    pcVar15 = optstr;
  }
  tvp = jas_tvparser_create(pcVar15);
  if (tvp == (jas_tvparser_t *)0x0) {
    return (jas_image_t *)0x0;
  }
  local_148 = 0x4000000;
  local_154 = 0;
  local_128 = in;
  while( true ) {
    iVar6 = jas_tvparser_next(tvp);
    uVar21 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (iVar6 != 0) break;
    pcVar15 = jas_tvparser_gettag(tvp);
    pjVar10 = jas_taginfos_lookup(pnm_decopts,pcVar15);
    pjVar10 = jas_taginfo_nonull(pjVar10);
    if (pjVar10->id == 1) {
      pcVar15 = jas_tvparser_getval(tvp);
      local_148 = strtoull(pcVar15,(char **)0x0,10);
    }
    else if (pjVar10->id == 0) {
      pcVar15 = jas_tvparser_getval(tvp);
      local_154 = atoi(pcVar15);
    }
    else {
      jas_eprintf("warning: ignoring invalid option %s\n",pcVar15);
    }
  }
  jas_tvparser_destroy(tvp);
  pjVar4 = local_128;
  uVar9 = local_128->flags_;
  if ((uVar9 & 7) == 0) {
    if ((local_128->rwlimit_ < 0) || (local_128->rwcnt_ < local_128->rwlimit_)) {
      iVar6 = local_128->cnt_;
      local_128->cnt_ = iVar6 + -1;
      if (iVar6 < 1) {
        uVar7 = jas_stream_fillbuf(local_128,1);
        if (uVar7 == 0xffffffff) goto LAB_00131f1b;
        uVar9 = pjVar4->flags_;
      }
      else {
        local_128->rwcnt_ = local_128->rwcnt_ + 1;
        pbVar1 = local_128->ptr_;
        local_128->ptr_ = pbVar1 + 1;
        uVar7 = (uint)*pbVar1;
      }
      if ((uVar9 & 7) == 0) {
        if ((-1 < pjVar4->rwlimit_) && (pjVar4->rwlimit_ <= pjVar4->rwcnt_)) goto LAB_00131fc3;
        iVar6 = pjVar4->cnt_;
        pjVar4->cnt_ = iVar6 + -1;
        if (iVar6 < 1) {
          uVar9 = jas_stream_fillbuf(pjVar4,1);
          if (uVar9 == 0xffffffff) goto LAB_00131f1b;
        }
        else {
          pjVar4->rwcnt_ = pjVar4->rwcnt_ + 1;
          pbVar1 = pjVar4->ptr_;
          pjVar4->ptr_ = pbVar1 + 1;
          uVar9 = (uint)*pbVar1;
        }
        iVar6 = pnm_getsintstr(pjVar4,&width);
        if ((iVar6 == 0) &&
           (iVar6 = pnm_getsintstr(pjVar4,(int_fast32_t *)&tmpval), uVar17 = tmpval, iVar6 == 0)) {
          local_118 = width;
          uVar14 = (ulong)(uVar9 & 0xff | (uVar7 & 0xff) << 8);
          iVar6 = pnm_type(uVar14);
          if (iVar6 != 0) {
            if (iVar6 == 1) {
              cmptparms[0].tlx = 1;
LAB_00132058:
              iVar8 = (int)cmptparms[0].tlx;
              local_13c = 0;
            }
            else {
              iVar8 = pnm_getsintstr(pjVar4,&cmptparms[0].tlx);
              if (iVar8 != 0) goto LAB_00131f1b;
              if (-1 < cmptparms[0].tlx) goto LAB_00132058;
              iVar8 = -(int)cmptparms[0].tlx;
              local_13c = 1;
            }
            uVar19 = local_118;
            local_130 = uVar14;
            if (iVar6 - 1U < 2) {
              local_158 = 1;
              local_120 = (ulong)local_120._4_4_ << 0x20;
            }
            else {
              if (iVar6 != 3) {
                abort();
              }
              local_158 = 3;
              local_120 = CONCAT44(local_120._4_4_,1);
            }
            maxval = (uint_fast32_t)iVar8;
            iVar8 = (int)local_118;
            iVar6 = (int)uVar17;
            if (9 < iVar5) {
              jas_eprintf("magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
                          uVar14,(long)iVar8,(long)iVar6,(ulong)local_158,maxval,
                          CONCAT44(uVar21,local_13c));
            }
            if (0 < iVar6 && 0 < iVar8) {
              uVar14 = (ulong)local_158;
              local_f0 = uVar17 & 0x7fffffff;
              uVar19 = uVar19 & 0x7fffffff;
              if ((local_148 != 0) &&
                 (uVar16 = local_f0 * uVar19 * uVar14,
                 local_148 <= uVar16 && uVar16 - local_148 != 0)) {
                jas_eprintf("maximum number of samples would be exceeded (%zu > %zu)\n");
                return (jas_image_t *)0x0;
              }
              for (lVar20 = 0; local_158 * 0x38 != (int)lVar20; lVar20 = lVar20 + 0x38) {
                *(undefined8 *)((long)&cmptparms[0].tlx + lVar20) = 0;
                *(undefined8 *)((long)&cmptparms[0].tly + lVar20) = 0;
                *(undefined8 *)((long)&cmptparms[0].hstep + lVar20) = 1;
                *(undefined8 *)((long)&cmptparms[0].vstep + lVar20) = 1;
                *(ulong *)((long)&cmptparms[0].width + lVar20) = uVar19;
                *(ulong *)((long)&cmptparms[0].height + lVar20) = local_f0;
                iVar5 = pnm_maxvaltodepth(maxval);
                *(int *)((long)&cmptparms[0].prec + lVar20) = iVar5;
                *(undefined4 *)((long)&cmptparms[0].sgnd + lVar20) = local_13c;
              }
              image = jas_image_create(local_158,cmptparms,0x4000);
              uVar16 = local_130;
              if (image != (jas_image_t *)0x0) {
                ppjVar2 = image->cmpts_;
                (*ppjVar2)->type_ = 0;
                jVar13 = 0x301;
                if ((char)local_120 != '\0') {
                  ppjVar2[1]->type_ = 1;
                  ppjVar2[2]->type_ = 2;
                  jVar13 = 0x401;
                }
                image->clrspc_ = jVar13;
                iVar5 = pnm_fmt(local_130);
                iVar6 = pnm_type(uVar16);
                if (iVar6 == 0) {
                  __assert_fail("type != PNM_TYPE_INVALID",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/pnm/pnm_dec.c"
                                ,0x16f,
                                "int pnm_getdata(jas_stream_t *, pnm_hdr_t *, jas_image_t *, int)");
                }
                iVar8 = pnm_maxvaltodepth(maxval);
                local_130 = CONCAT44(extraout_var,iVar8);
                local_f8 = 0;
                width = 0;
                uStack_100 = 0;
                uVar16 = 0;
LAB_0013225c:
                if (uVar14 != uVar16) goto code_r0x00132261;
                local_e0 = (long)(1 << ((char)local_130 - 1U & 0x1f));
                local_120 = width;
                local_10c = iVar6;
                for (uVar16 = 0; pjVar4 = local_128, uVar16 != local_f0; uVar16 = uVar16 + 1) {
                  local_e8 = uVar16;
                  if (local_10c == 1) {
                    if (iVar5 == 1) {
                      uVar16 = 0;
LAB_001322e2:
                      lVar20 = local_120;
                      iVar6 = (int)uVar16;
                      if (iVar6 < (int)local_118) {
                        if ((pjVar4->flags_ & 7U) != 0) goto LAB_00132279;
                        if ((-1 < pjVar4->rwlimit_) && (pjVar4->rwlimit_ <= pjVar4->rwcnt_)) {
                          pjVar4->flags_ = pjVar4->flags_ | 4;
                          goto LAB_00132279;
                        }
                        iVar8 = pjVar4->cnt_;
                        pjVar4->cnt_ = iVar8 + -1;
                        if (iVar8 < 1) {
                          uVar9 = jas_stream_fillbuf(pjVar4,1);
                          if (uVar9 == 0xffffffff) goto LAB_00132279;
                        }
                        else {
                          pjVar4->rwcnt_ = pjVar4->rwcnt_ + 1;
                          pbVar1 = pjVar4->ptr_;
                          pjVar4->ptr_ = pbVar1 + 1;
                          uVar9 = (uint)*pbVar1;
                        }
                        for (uVar16 = (ulong)iVar6; (long)(int)(iVar6 + 8U) != uVar16;
                            uVar16 = uVar16 + 1) {
                          if ((long)uVar19 <= (long)uVar16) goto LAB_001322e2;
                          *(ulong *)(**(long **)(lVar20 + 0x38) + uVar16 * 8) =
                               (ulong)(-1 < (char)uVar9);
                          uVar9 = uVar9 * 2;
                        }
                        uVar16 = (ulong)(iVar6 + 8U);
                        goto LAB_001322e2;
                      }
                    }
                    else {
                      for (uVar16 = 0; pjVar4 = local_128, uVar16 != uVar19; uVar16 = uVar16 + 1) {
                        do {
                          while (uVar9 = pnm_getc(pjVar4), uVar9 == 0x23) {
                            do {
                              iVar6 = pnm_getc(pjVar4);
                              if (iVar6 == -1) goto LAB_00132574;
                            } while (iVar6 != 10);
                          }
                          if (uVar9 == 0xffffffff) goto LAB_00132574;
                        } while ((uVar9 & 0xfffffffe) != 0x30);
                        *(ulong *)(**(long **)(local_120 + 0x38) + uVar16 * 8) =
                             (ulong)(0x31 - uVar9);
                      }
                    }
                  }
                  else {
                    for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
                      for (uVar18 = 0; uVar18 != uVar14; uVar18 = uVar18 + 1) {
                        if (iVar5 == 1) {
                          if ((char)local_13c == '\0') {
                            iVar6 = pnm_getuint(local_128,(int)local_130,&tmpval);
                            goto LAB_00132463;
                          }
                          iVar6 = pnm_getuint(local_128,(int)local_130,&tmpval);
                          if (iVar6 != 0) goto LAB_00132467;
                          uVar17 = tmpval;
                          if ((local_e0 & tmpval) != 0) {
                            jas_eprintf("PNM decoder does not fully support signed data\n");
                            goto LAB_00132467;
                          }
                        }
                        else {
                          if ((char)local_13c == '\0') {
                            do {
                              iVar6 = pnm_getc(local_128);
                              if (iVar6 == -1) goto LAB_00132467;
                              ppuVar12 = __ctype_b_loc();
                            } while ((*(byte *)((long)*ppuVar12 + (long)iVar6 * 2 + 1) & 0x20) != 0)
                            ;
                            uVar17 = 0;
                            do {
                              if (((*ppuVar12)[iVar6] >> 0xb & 1) == 0) {
                                if (((*ppuVar12)[iVar6] >> 0xd & 1) != 0) goto LAB_0013248a;
                                break;
                              }
                              uVar17 = (uVar17 * 10 + (long)iVar6) - 0x30;
                              iVar6 = pnm_getc(local_128);
                            } while (-1 < iVar6);
                            goto LAB_00132467;
                          }
                          iVar6 = pnm_getsintstr(local_128,(int_fast32_t *)&tmpval);
LAB_00132463:
                          uVar17 = tmpval;
                          if (iVar6 != 0) {
LAB_00132467:
                            if (local_154 == 0) goto LAB_00132574;
                            jas_eprintf("bad sample data\n");
                            uVar17 = 0;
                          }
                        }
LAB_0013248a:
                        *(uint_fast32_t *)(**(long **)((&width)[uVar18] + 0x38) + uVar16 * 8) =
                             uVar17;
                      }
                    }
                  }
                  uVar16 = local_e8;
                  uVar18 = 0;
                  while (uVar14 != uVar18) {
                    bVar3 = false;
                    iVar6 = jas_image_writecmpt(image,(uint)uVar18,0,uVar16,uVar19,1,
                                                (jas_matrix_t *)(&width)[uVar18]);
                    uVar18 = uVar18 + 1;
                    if (iVar6 != 0) goto LAB_0013257b;
                  }
                }
                bVar3 = true;
                goto LAB_0013257b;
              }
            }
          }
        }
      }
    }
    else {
LAB_00131fc3:
      pjVar4->flags_ = uVar9 | 4;
    }
  }
  goto LAB_00131f1b;
code_r0x00132261:
  pjVar11 = jas_matrix_create(1,uVar19);
  (&width)[uVar16] = (int_fast32_t)pjVar11;
  uVar16 = uVar16 + 1;
  if (pjVar11 == (jas_matrix_t *)0x0) goto LAB_00132279;
  goto LAB_0013225c;
LAB_00132574:
  bVar3 = false;
  goto LAB_0013257b;
LAB_00132279:
  bVar3 = false;
LAB_0013257b:
  for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
    if ((jas_matrix_t *)(&width)[uVar19] != (jas_matrix_t *)0x0) {
      jas_matrix_destroy((jas_matrix_t *)(&width)[uVar19]);
    }
  }
  if (!bVar3) {
    jas_image_destroy(image);
LAB_00131f1b:
    image = (jas_image_t *)0x0;
  }
  return image;
}

Assistant:

jas_image_t *pnm_decode(jas_stream_t *in, const char *optstr)
{
	pnm_hdr_t hdr;
	jas_image_t *image;
	jas_image_cmptparm_t cmptparms[3];
	jas_image_cmptparm_t *cmptparm;
	int i;
	pnm_dec_importopts_t opts;
	size_t num_samples;

	image = 0;

	JAS_DBGLOG(10, ("pnm_decode(%p, \"%s\")\n", in, optstr ? optstr : ""));

	if (pnm_dec_parseopts(optstr, &opts)) {
		goto error;
	}

	/* Read the file header. */
	if (pnm_gethdr(in, &hdr)) {
		goto error;
	}
	JAS_DBGLOG(10, (
	  "magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
	  JAS_CAST(unsigned long, hdr.magic), JAS_CAST(long, hdr.width),
	  JAS_CAST(long, hdr.height), hdr.numcmpts, JAS_CAST(long, hdr.maxval),
	  hdr.sgnd)
	  );

	if (hdr.width <= 0 || hdr.height <= 0) {
		goto error;
	}

	if (!jas_safe_size_mul3(hdr.width, hdr.height, hdr.numcmpts,
	  &num_samples)) {
		jas_eprintf("image too large\n");
		goto error;
	}
	if (opts.max_samples > 0 && num_samples > opts.max_samples) {
		jas_eprintf(
		  "maximum number of samples would be exceeded (%zu > %zu)\n",
		  num_samples, opts.max_samples);
		goto error;
	}

	/* Create an image of the correct size. */
	for (i = 0, cmptparm = cmptparms; i < hdr.numcmpts; ++i, ++cmptparm) {
		cmptparm->tlx = 0;
		cmptparm->tly = 0;
		cmptparm->hstep = 1;
		cmptparm->vstep = 1;
		cmptparm->width = hdr.width;
		cmptparm->height = hdr.height;
		cmptparm->prec = pnm_maxvaltodepth(hdr.maxval);
		cmptparm->sgnd = hdr.sgnd;
	}
	if (!(image = jas_image_create(hdr.numcmpts, cmptparms,
	  JAS_CLRSPC_UNKNOWN))) {
		goto error;
	}

	if (hdr.numcmpts == 3) {
		jas_image_setclrspc(image, JAS_CLRSPC_SRGB);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R));
		jas_image_setcmpttype(image, 1,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G));
		jas_image_setcmpttype(image, 2,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B));
	} else {
		jas_image_setclrspc(image, JAS_CLRSPC_SGRAY);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
	}

	/* Read image data from stream into image. */
	if (pnm_getdata(in, &hdr, image, opts.allow_trunc)) {
		goto error;
	}

	return image;

error:
	if (image) {
		jas_image_destroy(image);
	}
	return 0;
}